

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::StrictEqual(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  RecyclableObject *pRVar6;
  uint local_6c;
  TypeId local_68;
  BOOL result;
  TypeId leftType;
  TypeId rightType;
  ScriptContext *requestContext_local;
  Var aRight_local;
  Var aLeft_local;
  ScriptContext *local_40;
  TypeId local_34;
  Var local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  _leftType = requestContext;
  requestContext_local = (ScriptContext *)aRight;
  aRight_local = aLeft;
  local_30 = aLeft;
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(local_30);
  if (bVar2) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
    if (bVar2) {
      local_28 = TypeIds_Number;
    }
    else {
      pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
      if (pRStack_20 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_24 = RecyclableObject::GetTypeId(pRStack_20);
      if (0x57 < (int)local_24) {
        BVar3 = RecyclableObject::IsExternal(pRStack_20);
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
      local_28 = local_24;
    }
  }
  local_68 = local_28;
  if (((ScriptContext *)aRight_local == requestContext_local) && (local_28 != TypeIds_Number)) {
    aLeft_local._4_4_ = 1;
  }
  else {
    local_40 = requestContext_local;
    if (requestContext_local == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is(local_40);
    if (bVar2) {
      local_34 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_40);
      if (bVar2) {
        local_34 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_40);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if (0x57 < (int)local_14) {
          BVar3 = RecyclableObject::IsExternal(pRStack_10);
          if (BVar3 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
        local_34 = local_14;
      }
    }
    result = local_34;
    if (local_68 == TypeIds_String) {
      if (local_34 == TypeIds_String) {
        aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aRight_local);
        aRight_00 = UnsafeVarTo<Js::JavascriptString>(requestContext_local);
        bVar2 = JavascriptString::Equals(aLeft_00,aRight_00);
        aLeft_local._4_4_ = (uint)bVar2;
      }
      else {
        aLeft_local._4_4_ = 0;
      }
    }
    else if (((int)local_68 < 3) || (6 < (int)local_68)) {
      if (local_68 == TypeIds_GlobalObject) {
        pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aRight_local);
        iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x2f])
                          (pRVar6,requestContext_local,&local_6c,_leftType);
        if (iVar4 == 0) {
          aLeft_local._4_4_ = 0;
        }
        else {
          aLeft_local._4_4_ = local_6c;
        }
      }
      else if (local_68 == TypeIds_BigInt) {
        if (local_34 == TypeIds_BigInt) {
          bVar2 = JavascriptBigInt::Equals(aRight_local,requestContext_local);
          aLeft_local._4_4_ = (uint)bVar2;
        }
        else {
          aLeft_local._4_4_ = 0;
        }
      }
      else {
        aLeft_local._4_4_ = (uint)((ScriptContext *)aRight_local == requestContext_local);
      }
    }
    else {
      aLeft_local._4_4_ =
           StrictEqualNumberType(aRight_local,requestContext_local,local_68,local_34,_leftType);
    }
  }
  return aLeft_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::StrictEqual(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqual);
        TypeId rightType, leftType;
        leftType = JavascriptOperators::GetTypeId(aLeft);

        // Because NaN !== NaN, we may not return TRUE when typeId is Number
        if (aLeft == aRight && leftType != TypeIds_Number) return TRUE;

        rightType = JavascriptOperators::GetTypeId(aRight);

        if (leftType == TypeIds_String)
        {
            if (rightType == TypeIds_String)
            {
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            return FALSE;
        }
        else if (leftType >= TypeIds_Integer && leftType <= TypeIds_UInt64Number)
        {
            return JavascriptOperators::StrictEqualNumberType(aLeft, aRight, leftType, rightType, requestContext);
        }
        else if (leftType == TypeIds_GlobalObject)
        {
            BOOL result;
            if (UnsafeVarTo<RecyclableObject>(aLeft)->StrictEquals(aRight, &result, requestContext))
            {
                return result;
            }
            return false;
        }
        else if (leftType == TypeIds_BigInt)
        {
            if (rightType == TypeIds_BigInt)
            {
                return JavascriptBigInt::Equals(aLeft, aRight);
            }
            return FALSE;
        }

        return aLeft == aRight;
        JIT_HELPER_END(Op_StrictEqual);
    }